

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateBuilder
          (ImmutableMessageGenerator *this,Printer *printer)

{
  pointer pcVar1;
  MessageBuilderGenerator builderGenerator;
  undefined1 local_88 [112];
  
  io::Printer::Print<>
            (printer,
             "@java.lang.Override\npublic Builder newBuilderForType() { return newBuilder(); }\n");
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_88,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true
            );
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "public static Builder newBuilder() {\n  return DEFAULT_INSTANCE.toBuilder();\n}\npublic static Builder newBuilder($classname$ prototype) {\n  return DEFAULT_INSTANCE.toBuilder().mergeFrom(prototype);\n}\n@java.lang.Override\npublic Builder toBuilder() {\n  return this == DEFAULT_INSTANCE\n      ? new Builder() : new Builder().mergeFrom(this);\n}\n\n"
             ,(char (*) [10])0x3e9312,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  pcVar1 = local_88 + 0x10;
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_);
  }
  local_88._16_2_ = 0x3356;
  local_88._8_8_ = (Descriptor *)0x2;
  local_88[0x12] = '\0';
  local_88._0_8_ = pcVar1;
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer,
             "@java.lang.Override\nprotected Builder newBuilderForType(\n    com.google.protobuf.GeneratedMessage$ver$.BuilderParent parent) {\n  Builder builder = new Builder(parent);\n  return builder;\n}\n"
             ,(char (*) [4])0x3d9f76,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_);
  }
  MessageBuilderGenerator::MessageBuilderGenerator
            ((MessageBuilderGenerator *)local_88,(this->super_MessageGenerator).descriptor_,
             this->context_);
  MessageBuilderGenerator::Generate((MessageBuilderGenerator *)local_88,printer);
  MessageBuilderGenerator::~MessageBuilderGenerator((MessageBuilderGenerator *)local_88);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateBuilder(io::Printer* printer) {
  // LITE_RUNTIME implements this at the GeneratedMessageLite level.
  printer->Print(
      "@java.lang.Override\n"
      "public Builder newBuilderForType() { return newBuilder(); }\n");

  printer->Print(
      "public static Builder newBuilder() {\n"
      "  return DEFAULT_INSTANCE.toBuilder();\n"
      "}\n"
      "public static Builder newBuilder($classname$ prototype) {\n"
      "  return DEFAULT_INSTANCE.toBuilder().mergeFrom(prototype);\n"
      "}\n"
      "@java.lang.Override\n"
      "public Builder toBuilder() {\n"
      "  return this == DEFAULT_INSTANCE\n"
      "      ? new Builder() : new Builder().mergeFrom(this);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "@java.lang.Override\n"
      "protected Builder newBuilderForType(\n"
      "    com.google.protobuf.GeneratedMessage$ver$.BuilderParent parent) {\n"
      "  Builder builder = new Builder(parent);\n"
      "  return builder;\n"
      "}\n",
      "ver", GeneratedCodeVersionSuffix());

  MessageBuilderGenerator builderGenerator(descriptor_, context_);
  builderGenerator.Generate(printer);
}